

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_search.hpp
# Opt level: O3

int * burst::detail::
      galloping_search<int_const*,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>
                (int *first,int *last,int *value)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 local_19;
  
  piVar3 = std::
           __find_if<int_const*,__gnu_cxx::__ops::_Iter_negate<burst::detail::galloping_search<int_const*,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>(int_const*,int_const*,int_const&,burst::not_fn_t<burst::invert_t<std::less<void>>>)::_lambda(auto:1_const&)_1_>>
                     ();
  if ((piVar3 != last) &&
     (piVar3 = std::
               __find_if<int_const*,__gnu_cxx::__ops::_Iter_pred<burst::detail::galloping_search<int_const*,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>(int_const*,int_const*,int_const&,burst::not_fn_t<burst::invert_t<std::less<void>>>)::_lambda(auto:1_const&)_1_>>
                         (piVar3 + 1,last,value,&local_19), piVar3 != last)) {
    __assert_fail("std::is_partitioned(first, last, [& value, & compare] (const auto & e) {return compare(e, value);})"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/detail/galloping_search.hpp"
                  ,0x16,
                  "RandomAccessIterator burst::detail::galloping_search(RandomAccessIterator, RandomAccessIterator, const Value &, Compare) [RandomAccessIterator = const int *, Value = int, Compare = burst::not_fn_t<burst::invert_t<std::less<void>>>]"
                 );
  }
  lVar5 = (long)last - (long)first;
  iVar2 = *value;
  uVar7 = 1;
  lVar8 = 0;
  do {
    if (lVar5 >> 2 <= (long)(lVar8 + uVar7)) {
      uVar7 = (long)last - (long)first >> 2;
      while (0 < (long)uVar7) {
        uVar6 = uVar7 >> 1;
        uVar9 = ~uVar6 + uVar7;
        uVar7 = uVar6;
        if (first[uVar6] <= iVar2) {
          uVar7 = uVar9;
          first = first + uVar6 + 1;
        }
      }
      return first;
    }
    piVar1 = first + uVar7;
    if (iVar2 < *piVar1) {
      piVar4 = first;
      uVar6 = uVar7;
      if ((long)uVar7 < 1) {
        return first;
      }
      do {
        uVar9 = uVar6 >> 1;
        piVar3 = piVar4 + uVar9 + 1;
        uVar6 = ~uVar9 + uVar6;
        if (iVar2 < piVar4[uVar9]) {
          piVar3 = piVar4;
          uVar6 = uVar9;
        }
        piVar4 = piVar3;
      } while (0 < (long)uVar6);
    }
    else {
      first = first + uVar7 + 1;
      lVar8 = lVar8 + uVar7 + 1;
      uVar7 = uVar7 * 2;
    }
  } while (*piVar1 <= iVar2);
  return piVar3;
}

Assistant:

RandomAccessIterator
            galloping_search
            (
                RandomAccessIterator first, RandomAccessIterator last,
                const Value & value,
                Compare compare
            )
        {
            assert(std::is_partitioned(first, last,
                [& value, & compare] (const auto & e) {return compare(e, value);}));

            const auto distance = std::distance(first, last);

            auto position = static_cast<decltype(distance)>(0);
            auto step = static_cast<decltype(distance)>(1);

            while (position + step < distance)
            {
                const auto current = std::next(first, step);
                if (compare(*current, value))
                {
                    first = std::next(current);
                    position += step + 1;
                    step *= 2;
                }
                else
                {
                    return std::lower_bound(first, current, value, compare);
                }
            }

            return std::lower_bound(first, last, value, compare);
        }